

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapPerm.c
# Opt level: O0

int Amap_LibDeriveGatePerm
              (Amap_Lib_t *pLib,Amap_Gat_t *pGate,Kit_DsdNtk_t *pNtk,Amap_Nod_t *pNod,char *pArray)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  Vec_Int_t *p;
  int local_58;
  int local_54;
  int k;
  int i;
  int Entry2;
  int Entry;
  Vec_Int_t *vPerm;
  int fVerbose;
  char *pArray_local;
  Amap_Nod_t *pNod_local;
  Kit_DsdNtk_t *pNtk_local;
  Amap_Gat_t *pGate_local;
  Amap_Lib_t *pLib_local;
  
  iVar1 = Abc_LitRegular((uint)pNtk->Root);
  p = Amap_LibDeriveGatePerm_rec(pLib,pNtk,iVar1,pNod);
  if (p == (Vec_Int_t *)0x0) {
    pLib_local._4_4_ = 0;
  }
  else {
    uVar2 = Vec_IntSize(p);
    if (uVar2 != (*(uint *)pNod >> 0x10 & 0xff)) {
      __assert_fail("Vec_IntSize(vPerm) == (int)pNod->nSuppSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/amap/amapPerm.c"
                    ,0x156,
                    "int Amap_LibDeriveGatePerm(Amap_Lib_t *, Amap_Gat_t *, Kit_DsdNtk_t *, Amap_Nod_t *, char *)"
                   );
    }
    for (local_54 = 0; iVar1 = Vec_IntSize(p), local_54 < iVar1; local_54 = local_54 + 1) {
      iVar1 = Vec_IntEntry(p,local_54);
      local_58 = local_54;
      while( true ) {
        local_58 = local_58 + 1;
        iVar4 = Vec_IntSize(p);
        if (iVar4 <= local_58) break;
        iVar4 = Vec_IntEntry(p,local_58);
        iVar3 = Abc_Lit2Var(iVar1);
        iVar4 = Abc_Lit2Var(iVar4);
        if (iVar3 == iVar4) {
          Vec_IntFree(p);
          return 0;
        }
      }
    }
    for (local_54 = 0; iVar1 = Vec_IntSize(p), local_54 < iVar1; local_54 = local_54 + 1) {
      iVar1 = Vec_IntEntry(p,local_54);
      uVar2 = *(uint *)pNod >> 0x10 & 0xff;
      if (SBORROW4(iVar1,uVar2 * 2) == (int)(iVar1 + uVar2 * -2) < 0) {
        __assert_fail("Entry < 2 * (int)pNod->nSuppSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/amap/amapPerm.c"
                      ,0x162,
                      "int Amap_LibDeriveGatePerm(Amap_Lib_t *, Amap_Gat_t *, Kit_DsdNtk_t *, Amap_Nod_t *, char *)"
                     );
      }
      iVar4 = Abc_LitIsCompl(iVar1);
      iVar4 = Abc_Var2Lit(local_54,iVar4);
      iVar1 = Abc_Lit2Var(iVar1);
      pArray[iVar1] = (char)iVar4;
    }
    Vec_IntFree(p);
    pLib_local._4_4_ = 1;
  }
  return pLib_local._4_4_;
}

Assistant:

int Amap_LibDeriveGatePerm( Amap_Lib_t * pLib, Amap_Gat_t * pGate, Kit_DsdNtk_t * pNtk, Amap_Nod_t * pNod, char * pArray )
{
    int fVerbose = 0;
    Vec_Int_t * vPerm;
    int Entry, Entry2, i, k;
//    Kit_DsdPrint( stdout, pNtk );

    vPerm = Amap_LibDeriveGatePerm_rec( pLib, pNtk, Abc_LitRegular(pNtk->Root), pNod );
    if ( vPerm == NULL )
        return 0;
    // check that the permutation is valid
    assert( Vec_IntSize(vPerm) == (int)pNod->nSuppSize );
    Vec_IntForEachEntry( vPerm, Entry, i )
        Vec_IntForEachEntryStart( vPerm, Entry2, k, i+1 )
            if ( Abc_Lit2Var(Entry) == Abc_Lit2Var(Entry2) )
            {
                Vec_IntFree( vPerm );
                return 0;
            }

    // reverse the permutation
    Vec_IntForEachEntry( vPerm, Entry, i )
    {
        assert( Entry < 2 * (int)pNod->nSuppSize );
        pArray[Abc_Lit2Var(Entry)] = Abc_Var2Lit( i, Abc_LitIsCompl(Entry) );
//        pArray[i] = Entry;
//printf( "%d=%d%c ", Abc_Lit2Var(Entry), i, Abc_LitIsCompl(Entry)?'-':'+' );
    }
//printf( "\n" );
//    if ( Kit_DsdNonDsdSizeMax(pNtk) < 3 )
//        Amap_LibVerifyPerm( pLib, pGate, pNtk, pNod, Vec_IntArray(vPerm) );
    Vec_IntFree( vPerm );
    // print the result
    if ( fVerbose )
    {
    printf( "node %4d : ", pNod->Id );
    for ( i = 0; i < (int)pNod->nSuppSize; i++ )
        printf( "%d=%d%c ", i, Abc_Lit2Var(pArray[i]), Abc_LitIsCompl(pArray[i])?'-':'+' );
    printf( "\n" );
    }
    return 1;
}